

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.h
# Opt level: O3

void __thiscall chrono::fea::ChTriangleOfXYZnodes::~ChTriangleOfXYZnodes(ChTriangleOfXYZnodes *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_ChVariableTupleCarrier_3vars<3,_3,_3>)._vptr_ChVariableTupleCarrier_3vars =
       (_func_int **)&PTR__ChTriangleOfXYZnodes_00b29288;
  p_Var1 = (this->mnodeB3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->mnodeB2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->mnodeB1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

class ChApi ChTriangleOfXYZnodes : public ChVariableTupleCarrier_3vars<3, 3, 3> {
  public:
    std::shared_ptr<fea::ChNodeFEAxyz> mnodeB1;
    std::shared_ptr<fea::ChNodeFEAxyz> mnodeB2;
    std::shared_ptr<fea::ChNodeFEAxyz> mnodeB3;

    virtual ChVariables* GetVariables1() override { return &mnodeB1->Variables(); }
    virtual ChVariables* GetVariables2() override { return &mnodeB2->Variables(); }
    virtual ChVariables* GetVariables3() override { return &mnodeB3->Variables(); }
}